

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O0

uint8_t * __thiscall
arangodb::velocypack::Builder::addInternal<arangodb::velocypack::ValuePair>
          (Builder *this,ValuePair *sub)

{
  bool bVar1;
  long in_RDI;
  ValuePair *in_stack_00000018;
  Builder *in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  bVar1 = std::
          vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
          ::empty((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                   *)in_stack_ffffffffffffffe0);
  if (bVar1) {
    local_8 = set((Builder *)sub,in_stack_00000018);
  }
  else {
    if ((*(byte *)(in_RDI + 0xa8) & 1) == 0) {
      reportAdd(in_stack_ffffffffffffffe0);
    }
    local_8 = set((Builder *)sub,in_stack_00000018);
  }
  return local_8;
}

Assistant:

uint8_t* addInternal(T const& sub) {
    if (_stack.empty() || std::is_same<T, Serializable>::value) {
      return set(sub);
    }

    if (!_keyWritten) {
      reportAdd();
    }
    try {
      return set(sub);
    } catch (...) {
      // clean up in case of an exception
      cleanupAdd();
      throw;
    }
  }